

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillRightAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *local_28;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  local_28 = node;
  while (local_28->next->point->x < edge->p->x) {
    OVar1 = Orient2d(edge->q,local_28->next->point,edge->p);
    if (OVar1 == CCW) {
      FillRightBelowEdgeEvent(this,tcx,edge,local_28);
    }
    else {
      local_28 = local_28->next;
    }
  }
  return;
}

Assistant:

void Sweep::FillRightAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->next->point->x < edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->next->point, *edge->p) == CCW) {
      FillRightBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->next;
    }
  }
}